

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# munkres.hxx
# Opt level: O1

Index __thiscall
markurem::matching::
Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
::find_prime_in_row(Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
                    *this,Index row)

{
  int iVar1;
  pointer pVVar2;
  pointer pAVar3;
  pointer piVar4;
  pointer pAVar5;
  pointer pAVar6;
  runtime_error *this_00;
  bool bVar7;
  
  pVVar2 = (this->graph_->vertices_).
           super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pAVar6 = *(pointer *)&((Adjacencies *)((long)(pVVar2 + row) + 0x20))->vector_;
  pAVar3 = *(pointer *)((long)(pVVar2 + row) + 0x28);
  bVar7 = pAVar6 == pAVar3;
  if (!bVar7) {
    piVar4 = (this->mask_->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar1 = piVar4[pAVar6->edge_];
    pAVar5 = pAVar6;
    while (iVar1 != 2) {
      pAVar6 = pAVar5 + 1;
      bVar7 = pAVar6 == pAVar3;
      if (bVar7) goto LAB_00139438;
      iVar1 = piVar4[*(Value *)((long)(pAVar5 + 1) + 8)];
      pAVar5 = pAVar6;
    }
    pAVar6 = (pointer)pAVar5->vertex_;
  }
LAB_00139438:
  if (!bVar7) {
    return (Index)pAVar6;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Could not find prime in given row!");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

typename Matching<GRAPH, COST, MASK>::Index
Matching<GRAPH, COST, MASK>::find_prime_in_row(Index const row) const
{

    for (auto it = graph_.adjacenciesFromVertexBegin(row);
         it != graph_.adjacenciesFromVertexEnd(row); ++it)
        if (mask_[it->edge()] == PRIMED)
            return it->vertex();

    throw std::runtime_error("Could not find prime in given row!");
}